

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
insert<kj::TreeMap<kj::String,int>::Entry,kj::String&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,size_t pos,String *params)

{
  bool bVar1;
  size_t index;
  StringPtr *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this_00;
  String *in_R9;
  Maybe<unsigned_long> MVar3;
  size_t local_78;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:1530:22)>
  local_70;
  undefined1 local_50 [8];
  Iterator iter;
  String *params_local;
  size_t pos_local;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)table.ptr;
  iter._16_8_ = in_R9;
  table_local.ptr = (StringPtr *)pos;
  table_local.size_ = (size_t)this;
  searchKey<kj::TreeMap<kj::String,int>::Entry,kj::String>
            (&local_70,this_00,(ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,in_R9);
  kj::_::BTreeImpl::insert((Iterator *)local_50,(BTreeImpl *)(this_00 + 8),(SearchKey *)&local_70);
  bVar1 = kj::_::BTreeImpl::Iterator::isEnd((Iterator *)local_50);
  if (!bVar1) {
    index = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
    e = ArrayPtr<kj::TreeMap<kj::String,_int>::Entry>::operator[]
                  ((ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,index);
    bVar1 = TreeMap<kj::String,int>::Callbacks::matches<kj::String&>
                      ((Callbacks *)this_00,e,(String *)iter._16_8_);
    if (bVar1) {
      local_78 = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_78);
      aVar2 = extraout_RDX;
      goto LAB_0024f96c;
    }
  }
  kj::_::BTreeImpl::Iterator::insert((Iterator *)local_50,(BTreeImpl *)(this_00 + 8),(uint)params);
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  aVar2 = extraout_RDX_00;
LAB_0024f96c:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }